

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

Token * string(Scanner *scanner,char quotation_mark)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 *in_RDI;
  char cVar4;
  
  cVar4 = *scanner->current;
  if (cVar4 != '\0') {
    pcVar2 = scanner->current + 1;
    pcVar3 = pcVar2;
    do {
      scanner->current = pcVar2;
      if (cVar4 == quotation_mark) {
        *in_RDI = 4;
        pcVar2 = scanner->start;
        *(char **)(in_RDI + 2) = pcVar2;
        *(ulong *)(in_RDI + 4) = (ulong)(uint)((int)pcVar3 - (int)pcVar2);
        uVar1 = scanner->line;
        goto LAB_00107eeb;
      }
      cVar4 = *pcVar2;
      pcVar3 = pcVar3 + 1;
      pcVar2 = pcVar2 + 1;
    } while (cVar4 != '\0');
  }
  uVar1 = scanner->line;
  *in_RDI = 0x2c;
  *(char **)(in_RDI + 2) = "Unterminated String";
  *(undefined8 *)(in_RDI + 4) = 0x13;
LAB_00107eeb:
  in_RDI[6] = uVar1;
  return (Token *)(ulong)uVar1;
}

Assistant:

static Token string(Scanner *scanner, char quotation_mark) {
    while (!at_end(scanner) && peek(scanner) != quotation_mark) {
        advance(scanner);
    }

    if (at_end(scanner)) {
        return error_token(scanner, "Unterminated String");
    }

    advance(scanner);
    return make_token(scanner, TOKEN_STRING);
}